

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_apply_householder_matrix<double>
               (double *mat_a,int rows,int cols,double *house_mat,int house_length,int offset_rows,
               int offset_cols)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  undefined1 auVar5 [8];
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  int j;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int k;
  ulong uVar12;
  double current;
  double dVar13;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> rhs;
  allocator_type local_31;
  
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(in_register_00000034,rows);
  uVar3 = (cols - rows) + house_length;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,(long)(int)(uVar3 * house_length),
             &local_31);
  lVar2 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  uVar1 = 0;
  if (0 < house_length) {
    uVar1 = (ulong)(uint)house_length;
  }
  iVar6 = offset_rows * cols + offset_cols;
  for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
    for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
      *(double *)((long)local_68 + uVar9 * 8 + lVar2) = mat_a[iVar6 + (int)uVar9];
    }
    lVar2 = lVar2 + (long)(int)uVar3 * 8;
    iVar6 = iVar6 + cols;
  }
  uVar11 = (int)rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage - offset_rows;
  uVar7 = 0;
  uVar4 = (ulong)(uint)(cols - offset_cols);
  if (cols - offset_cols < 1) {
    uVar4 = uVar7;
  }
  uVar9 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    auVar5 = local_68;
    for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
      dVar13 = 0.0;
      pdVar8 = (double *)auVar5;
      for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
        dVar13 = dVar13 + house_mat[uVar12] * *pdVar8;
        pdVar8 = pdVar8 + (int)uVar3;
      }
      mat_a[((int)uVar7 + offset_rows) * cols + offset_cols + (int)uVar10] = dVar13;
      auVar5 = (undefined1  [8])((long)auVar5 + 8);
    }
    house_mat = house_mat + house_length;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_68);
  return;
}

Assistant:

void
matrix_apply_householder_matrix (T* mat_a, int rows, int cols,
    T const* house_mat, int house_length, int offset_rows, int offset_cols)
{
    /* Save block from old matrix that will be modified. */
    int house_length_n = house_length - (rows - cols);
    std::vector<T> rhs(house_length * house_length_n);
    for (int i = 0; i < house_length; ++i)
    {
        for (int j = 0; j < house_length_n; ++j)
        {
            rhs[i * house_length_n + j] = mat_a[(offset_rows + i) *
                cols + (offset_cols + j)];
        }
    }

    /* Multiply block matrices. */
    for (int i = 0; i < (rows - offset_rows); ++i)
    {
        for (int j = 0; j < (cols - offset_cols); ++j)
        {
            T current(0);
            for (int k = 0; k < house_length; ++k)
            {
                current += (house_mat[i * house_length + k] *
                    rhs[k * house_length_n + j]);
            }
            mat_a[(offset_rows + i) * cols + (offset_cols + j)] = current;
        }
    }
}